

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

void __thiscall ncnn::ConvolutionDepthWise::~ConvolutionDepthWise(ConvolutionDepthWise *this)

{
  size_type sVar1;
  reference ppLVar2;
  undefined8 *in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int local_10;
  int local_c;
  
  *in_RDI = &PTR__ConvolutionDepthWise_00177d68;
  local_c = 0;
  while( true ) {
    iVar4 = local_c;
    sVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x34));
    if ((int)sVar1 <= iVar4) break;
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x34),
                         (long)local_c);
    if (*ppLVar2 != (value_type)0x0) {
      (*(*ppLVar2)->_vptr_Layer[1])();
    }
    local_c = local_c + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x161edc);
  local_10 = 0;
  while( true ) {
    iVar3 = local_10;
    sVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x37));
    if ((int)sVar1 <= iVar3) break;
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x37),
                         (long)local_10);
    if (*ppLVar2 != (value_type)0x0) {
      (*(*ppLVar2)->_vptr_Layer[1])();
    }
    local_10 = local_10 + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x161f55);
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::~vector
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
             CONCAT44(iVar4,in_stack_ffffffffffffffe0));
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::~vector
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
             CONCAT44(iVar4,in_stack_ffffffffffffffe0));
  Mat::~Mat((Mat *)0x161f88);
  Mat::~Mat((Mat *)0x161f99);
  Mat::~Mat((Mat *)0x161faa);
  Mat::~Mat((Mat *)0x161fbb);
  Layer::~Layer((Layer *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

ConvolutionDepthWise::~ConvolutionDepthWise()
{
    for (int i=0; i<(int)quantize_ops.size(); i++)
        delete quantize_ops[i];

    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
        delete dequantize_ops[i];

    dequantize_ops.clear();
}